

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_4> __thiscall
gl4cts::Math::greaterThan<4>(Math *this,Vector<double,_4> *left,Vector<double,_4> *right)

{
  Vector<unsigned_int,_4> VVar1;
  Vector<bool,_4> local_24;
  Vector<double,_4> *local_20;
  Vector<double,_4> *right_local;
  Vector<double,_4> *left_local;
  
  local_20 = right;
  right_local = left;
  left_local = (Vector<double,_4> *)this;
  tcu::greaterThan<double,4>((tcu *)&local_24,left,right);
  VVar1 = convertBvecToUvec<4>(this,&local_24);
  VVar1.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar1.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThan(const tcu::Vector<glw::GLdouble, Size>& left,
												  const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThan(left, right));
}